

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O0

XMLContentModel * __thiscall xercesc_4_0::DTDElementDecl::makeContentModel(DTDElementDecl *this)

{
  int iVar1;
  MemoryManager *pMVar2;
  undefined4 extraout_var;
  RuntimeException *this_00;
  MixedContentModel *local_18;
  XMLContentModel *cmRet;
  DTDElementDecl *this_local;
  
  if (*(int *)&(this->super_XMLElementDecl).field_0x2c == 2) {
    pMVar2 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    local_18 = (MixedContentModel *)XMemory::operator_new(0x30,pMVar2);
    iVar1 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[9])();
    pMVar2 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    MixedContentModel::MixedContentModel
              (local_18,true,(ContentSpecNode *)CONCAT44(extraout_var,iVar1),false,pMVar2);
  }
  else {
    if (*(int *)&(this->super_XMLElementDecl).field_0x2c != 3) {
      this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
      pMVar2 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
      RuntimeException::RuntimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
                 ,0x10c,CM_MustBeMixedOrChildren,pMVar2);
      __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    local_18 = (MixedContentModel *)createChildModel(this);
  }
  return &local_18->super_XMLContentModel;
}

Assistant:

XMLContentModel* DTDElementDecl::makeContentModel()
{
    XMLContentModel* cmRet = 0;
    if (fModelType == Mixed_Simple)
    {
        //
        //  Just create a mixel content model object. This type of
        //  content model is optimized for mixed content validation.
        //
        cmRet = new (getMemoryManager()) MixedContentModel(true, this->getContentSpec(), false, getMemoryManager());
    }
     else if (fModelType == Children)
    {
        //
        //  This method will create an optimal model for the complexity
        //  of the element's defined model. If its simple, it will create
        //  a SimpleContentModel object. If its a simple list, it will
        //  create a SimpleListContentModel object. If its complex, it
        //  will create a DFAContentModel object.
        //
        cmRet = createChildModel();
    }
     else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_MustBeMixedOrChildren, getMemoryManager());
    }
    return cmRet;
}